

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::UninterpretedOption::InternalSwap
          (UninterpretedOption *this,UninterpretedOption *other)

{
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  UninterpretedOption *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **__a;
  long in_RSI;
  long in_RDI;
  UnknownFieldSet *in_stack_fffffffffffffeb8;
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *in_stack_fffffffffffffec0;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *in_stack_fffffffffffffef0;
  
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)(in_RSI + 8);
  if (((uint)*(undefined8 *)(in_RDI + 8) & 1) != 1) {
    if (((uint)*(undefined8 *)this_00 & 1) != 1) goto LAB_0069bb18;
  }
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
    ::
    PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
              (this_00);
  }
  else {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    ::mutable_unknown_fields_slow(in_stack_fffffffffffffef0);
  }
  internal::InternalMetadataWithArena::DoSwap
            ((InternalMetadataWithArena *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
LAB_0069bb18:
  std::swap<unsigned_int>((uint *)(in_RDI + 0x10),(uint *)(in_RSI + 0x10));
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::InternalSwap
            (in_stack_fffffffffffffec0,
             (RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *)
             in_stack_fffffffffffffeb8);
  this_01 = (UninterpretedOption *)(in_RDI + 0x30);
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(this_01);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RSI + 0x30));
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(this_01);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDI + 0x38),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RSI + 0x38));
  __a = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDI + 0x40);
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(this_01);
  std::swap<std::__cxx11::string*>
            (__a,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                 (in_RSI + 0x40));
  std::swap<unsigned_long>((unsigned_long *)(in_RDI + 0x48),(unsigned_long *)(in_RSI + 0x48));
  std::swap<long>((long *)(in_RDI + 0x50),(long *)(in_RSI + 0x50));
  std::swap<double>((double *)(in_RDI + 0x58),(double *)(in_RSI + 0x58));
  return;
}

Assistant:

void UninterpretedOption::InternalSwap(UninterpretedOption* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  name_.InternalSwap(&other->name_);
  identifier_value_.Swap(&other->identifier_value_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  string_value_.Swap(&other->string_value_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  aggregate_value_.Swap(&other->aggregate_value_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(positive_int_value_, other->positive_int_value_);
  swap(negative_int_value_, other->negative_int_value_);
  swap(double_value_, other->double_value_);
}